

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalRecursiveCTE::Deserialize(LogicalRecursiveCTE *this,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  _Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false> this_00;
  pointer pLVar4;
  idx_t iVar5;
  undefined4 extraout_var_00;
  pointer *__ptr;
  unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
  result;
  _Tuple_impl<0UL,_duckdb::LogicalRecursiveCTE_*,_std::default_delete<duckdb::LogicalRecursiveCTE>_>
  local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  int iVar3;
  undefined4 extraout_var;
  
  this_00._M_head_impl = (LogicalRecursiveCTE *)operator_new(200);
  LogicalOperator::LogicalOperator((LogicalOperator *)this_00._M_head_impl,LOGICAL_RECURSIVE_CTE);
  ((this_00._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalRecursiveCTE_024ac5c0;
  ((this_00._M_head_impl)->ctename)._M_dataplus._M_p =
       (pointer)&((this_00._M_head_impl)->ctename).field_2;
  ((this_00._M_head_impl)->ctename)._M_string_length = 0;
  ((this_00._M_head_impl)->ctename).field_2._M_local_buf[0] = '\0';
  ((this_00._M_head_impl)->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((this_00._M_head_impl)->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((this_00._M_head_impl)->key_targets).
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((this_00._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((this_00._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((this_00._M_head_impl)->correlated_columns).
  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>)
       (_Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>)this_00._M_head_impl;
  pLVar4 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"union_all");
  if ((char)uVar2 == '\0') {
    uVar1 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  (pLVar4->super_LogicalOperator).field_0x61 = uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pLVar4 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"ctename");
  if ((char)uVar2 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar4->ctename,(string *)&local_50);
    if (local_50 == local_40) goto LAB_01766705;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar4->ctename,(string *)&local_50);
    if (local_50 == local_40) goto LAB_01766705;
  }
  operator_delete(local_50);
LAB_01766705:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pLVar4 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"table_index");
  if ((char)uVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var,iVar3);
  }
  pLVar4->table_index = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pLVar4 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcb,"column_count");
  if ((char)uVar2 == '\0') {
    iVar5 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar5 = CONCAT44(extraout_var_00,iVar3);
  }
  pLVar4->column_count = iVar5;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  pLVar4 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_58);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcc,"key_targets",&pLVar4->key_targets);
  pLVar4 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_58);
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xcd,"ref_recurring");
  if ((char)uVar2 == '\0') {
    uVar1 = 0;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  (pLVar4->super_LogicalOperator).field_0x62 = uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)
       local_58.super__Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalRecursiveCTE::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalRecursiveCTE>(new LogicalRecursiveCTE());
	deserializer.ReadPropertyWithDefault<bool>(200, "union_all", result->union_all);
	deserializer.ReadPropertyWithDefault<string>(201, "ctename", result->ctename);
	deserializer.ReadPropertyWithDefault<idx_t>(202, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(203, "column_count", result->column_count);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(204, "key_targets", result->key_targets);
	deserializer.ReadPropertyWithDefault<bool>(205, "ref_recurring", result->ref_recurring);
	return std::move(result);
}